

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

int Gia_ManArePerform(Gia_Man_t *pAig,int nStatesMax,int fMiter,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_PtrAre_t Sta;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  abctime aVar8;
  Gia_Man_t *pAig_00;
  Gia_ManAre_t *p_00;
  Gia_StaAre_t *pSta;
  Abc_Cex_t *pAVar9;
  char *pcVar10;
  abctime aVar11;
  abctime aVar12;
  abctime aVar13;
  double local_c8;
  double local_b0;
  double local_98;
  double local_80;
  int local_3c;
  int RetValue;
  abctime clk;
  Gia_ManAre_t *p;
  int fVerbose_local;
  int fMiter_local;
  int nStatesMax_local;
  Gia_Man_t *pAig_local;
  
  aVar8 = Abc_Clock();
  local_3c = 1;
  iVar4 = Gia_ManRegNum(pAig);
  if (iVar4 < 0x4001) {
    if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
      free(pAig->pCexSeq);
      pAig->pCexSeq = (Abc_Cex_t *)0x0;
    }
    pAig_00 = Gia_ManDup(pAig);
    p_00 = Gia_ManAreCreate(pAig_00);
    p_00->fMiter = fMiter;
    pSta = Gia_ManAreCreateStaInit(p_00);
    Gia_ManAreCubeProcess(p_00,pSta);
    p_00->iStaCur = 1;
    while (p_00->iStaCur < p_00->nStas) {
      Sta = Gia_Int2Ptr(p_00->iStaCur);
      iVar4 = Gia_ManAreDeriveNexts(p_00,Sta);
      if ((iVar4 != 0) || (nStatesMax < p_00->nStas)) {
        pAVar9 = Gia_ManAreDeriveCex(p_00,p_00->pTarget);
        pAig->pCexSeq = pAVar9;
      }
      if (p_00->fStopped != 0) {
        local_3c = -1;
        break;
      }
      if (fVerbose != 0) {
        Gia_ManArePrintReport(p_00,aVar8,0);
      }
      p_00->iStaCur = p_00->iStaCur + 1;
    }
    Gia_ManArePrintReport(p_00,aVar8,1);
    pcVar10 = "Completed";
    if (p_00->fStopped != 0) {
      pcVar10 = "Stopped";
    }
    uVar7 = p_00->nStas;
    uVar5 = Gia_ManAreListCountUsed(p_00);
    uVar6 = Gia_ManAreDepth(p_00,p_00->iStaCur + -1);
    printf("%s after finding %d state cubes (%d not contained) with depth %d.  ",pcVar10,
           (ulong)uVar7,(ulong)uVar5,(ulong)uVar6);
    Abc_Print(1,"%s =","Time");
    aVar11 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar11 - aVar8) * 1.0) / 1000000.0);
    if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
      uVar7 = p_00->iStaCur;
      pcVar10 = pAig->pName;
      iVar4 = Gia_ManAreDepth(p_00,p_00->iStaCur);
      Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d.\n",(ulong)uVar7,pcVar10,
                (ulong)(iVar4 - 1));
    }
    if (fVerbose != 0) {
      Abc_Print(1,"%s =","Cofactoring");
      iVar4 = p_00->timeAig;
      iVar1 = p_00->timeCube;
      aVar11 = Abc_Clock();
      if (aVar11 == aVar8) {
        local_80 = 0.0;
      }
      else {
        iVar2 = p_00->timeAig;
        iVar3 = p_00->timeCube;
        aVar11 = Abc_Clock();
        local_80 = ((double)(iVar2 - iVar3) * 100.0) / (double)(aVar11 - aVar8);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(iVar4 - iVar1) * 1.0) / 1000000.0,local_80);
      Abc_Print(1,"%s =","Containment");
      iVar4 = p_00->timeCube;
      aVar11 = Abc_Clock();
      if (aVar11 == aVar8) {
        local_98 = 0.0;
      }
      else {
        iVar1 = p_00->timeCube;
        aVar11 = Abc_Clock();
        local_98 = ((double)iVar1 * 100.0) / (double)(aVar11 - aVar8);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)iVar4 * 1.0) / 1000000.0,local_98);
      Abc_Print(1,"%s =","Other      ");
      aVar11 = Abc_Clock();
      iVar4 = p_00->timeAig;
      aVar12 = Abc_Clock();
      if (aVar12 == aVar8) {
        local_b0 = 0.0;
      }
      else {
        aVar12 = Abc_Clock();
        iVar1 = p_00->timeAig;
        aVar13 = Abc_Clock();
        local_b0 = ((double)((aVar12 - aVar8) - (long)iVar1) * 100.0) / (double)(aVar13 - aVar8);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",
                ((double)((aVar11 - aVar8) - (long)iVar4) * 1.0) / 1000000.0,local_b0);
      Abc_Print(1,"%s =","TOTAL      ");
      aVar11 = Abc_Clock();
      aVar12 = Abc_Clock();
      if (aVar12 == aVar8) {
        local_c8 = 0.0;
      }
      else {
        aVar12 = Abc_Clock();
        aVar13 = Abc_Clock();
        local_c8 = ((double)(aVar12 - aVar8) * 100.0) / (double)(aVar13 - aVar8);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(aVar11 - aVar8) * 1.0) / 1000000.0,local_c8);
    }
    iVar4 = Gia_ManRegNum(pAig);
    if (iVar4 < 0x1f) {
      aVar8 = Abc_Clock();
      uVar7 = Gia_ManCountMinterms(p_00);
      printf("The number of unique state minterms in computed state cubes is %d.   ",(ulong)uVar7);
      Abc_Print(1,"%s =","Time");
      aVar11 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar11 - aVar8) * 1.0) / 1000000.0);
    }
    Gia_ManAreFree(p_00);
    if (pAig->pCexSeq == (Abc_Cex_t *)0x0) {
      pAig_local._4_4_ = local_3c;
    }
    else {
      iVar4 = Gia_ManVerifyCex(pAig,pAig->pCexSeq,0);
      if (iVar4 == 0) {
        printf("Generated counter-example is INVALID.                       \n");
      }
      else {
        printf("Generated counter-example verified correctly.               \n");
      }
      pAig_local._4_4_ = 0;
    }
  }
  else {
    printf("Currently can only handle circuit with up to %d registers.\n",0x4000);
    pAig_local._4_4_ = -1;
  }
  return pAig_local._4_4_;
}

Assistant:

int Gia_ManArePerform( Gia_Man_t * pAig, int nStatesMax, int fMiter, int fVerbose )
{
//    extern Gia_Man_t * Gia_ManCompress2( Gia_Man_t * p, int fUpdateLevel, int fVerbose );
    extern Abc_Cex_t * Gia_ManAreDeriveCex( Gia_ManAre_t * p, Gia_StaAre_t * pLast );
    Gia_ManAre_t * p;
    abctime clk = Abc_Clock();
    int RetValue = 1;
    if ( Gia_ManRegNum(pAig) > MAX_VARS_NUM )
    {
        printf( "Currently can only handle circuit with up to %d registers.\n", MAX_VARS_NUM );
        return -1;
    }
    ABC_FREE( pAig->pCexSeq );
//    p = Gia_ManAreCreate( Gia_ManCompress2(pAig, 0, 0) );
    p = Gia_ManAreCreate( Gia_ManDup(pAig) );
    p->fMiter = fMiter;
    Gia_ManAreCubeProcess( p, Gia_ManAreCreateStaInit(p) );
    for ( p->iStaCur = 1; p->iStaCur < p->nStas; p->iStaCur++ )
    {
//        printf( "Explored state %d. Total cubes %d.\n", p->iStaCur, p->nStas-1 );
        if ( Gia_ManAreDeriveNexts( p, Gia_Int2Ptr(p->iStaCur) ) || p->nStas > nStatesMax )
            pAig->pCexSeq = Gia_ManAreDeriveCex( p, p->pTarget );
        if ( p->fStopped )
        {
            RetValue = -1;
            break;
        }
        if ( fVerbose )//&& p->iStaCur % 5000 == 0 )
            Gia_ManArePrintReport( p, clk, 0 );
    }
    Gia_ManArePrintReport( p, clk, 1 );
    printf( "%s after finding %d state cubes (%d not contained) with depth %d.  ", 
        p->fStopped ? "Stopped" : "Completed", 
        p->nStas, Gia_ManAreListCountUsed(p), 
        Gia_ManAreDepth(p, p->iStaCur-1) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    if ( pAig->pCexSeq != NULL )
        Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.\n", 
            p->iStaCur, pAig->pName, Gia_ManAreDepth(p, p->iStaCur)-1 );
    if ( fVerbose )
    {
        ABC_PRTP( "Cofactoring", p->timeAig - p->timeCube,    Abc_Clock() - clk );
        ABC_PRTP( "Containment", p->timeCube,                 Abc_Clock() - clk );
        ABC_PRTP( "Other      ", Abc_Clock() - clk - p->timeAig,  Abc_Clock() - clk );
        ABC_PRTP( "TOTAL      ", Abc_Clock() - clk,               Abc_Clock() - clk );
    }
    if ( Gia_ManRegNum(pAig) <= 30 )
    {
        clk = Abc_Clock();
        printf( "The number of unique state minterms in computed state cubes is %d.   ", Gia_ManCountMinterms(p) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
//    printf( "Compares = %d.  Equals = %d.  Disj = %d.  Disj2 = %d.  Disj3 = %d.\n", 
//        p->nCompares, p->nEquals, p->nDisjs, p->nDisjs2, p->nDisjs3 );
//    Gia_ManAreFindBestVar( p, Gia_ManAreSta(p, p->Root) );
//    Gia_ManArePrintUsed( p );
    Gia_ManAreFree( p );
    // verify
    if ( pAig->pCexSeq )
    {
        if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            printf( "Generated counter-example is INVALID.                       \n" );
        else
            printf( "Generated counter-example verified correctly.               \n" );
        return 0;
    }
    return RetValue;
}